

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

int av1_loop_restoration_corners_in_sb
              (AV1Common *cm,int plane,int mi_row,int mi_col,BLOCK_SIZE bsize,int *rcol0,int *rcol1,
              int *rrow0,int *rrow1)

{
  byte bVar1;
  byte bVar2;
  SequenceHeader *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  pSVar3 = cm->seq_params;
  if (pSVar3->sb_size == bsize) {
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    if (plane < 1) {
      bVar9 = false;
      bVar10 = false;
    }
    else {
      bVar9 = pSVar3->subsampling_x != 0;
      bVar10 = pSVar3->subsampling_y != 0;
    }
    iVar5 = cm->rst_info[plane].restoration_unit_size;
    iVar7 = cm->rst_info[plane].vert_units;
    uVar8 = 4 >> bVar9;
    iVar6 = cm->rst_info[plane].horz_units;
    if (cm->width != cm->superres_upscaled_width) {
      uVar8 = uVar8 * cm->superres_scale_denominator;
    }
    iVar4 = iVar5 * 8;
    if (cm->width == cm->superres_upscaled_width) {
      iVar4 = iVar5;
    }
    *rcol0 = (int)(mi_col * uVar8 + iVar4 + -1) / iVar4;
    *rrow0 = (int)(mi_row * (4U >> bVar10) + iVar5 + -1) / iVar5;
    iVar4 = (int)(((uint)bVar2 + mi_col) * uVar8 + iVar4 + -1) / iVar4;
    if (iVar4 < iVar6) {
      iVar6 = iVar4;
    }
    *rcol1 = iVar6;
    iVar5 = (int)(((uint)bVar1 + mi_row) * (4U >> bVar10) + iVar5 + -1) / iVar5;
    if (iVar5 < iVar7) {
      iVar7 = iVar5;
    }
    *rrow1 = iVar7;
    if (*rcol0 < *rcol1) {
      return (uint)(*rrow0 < iVar7);
    }
  }
  return 0;
}

Assistant:

int av1_loop_restoration_corners_in_sb(const struct AV1Common *cm, int plane,
                                       int mi_row, int mi_col, BLOCK_SIZE bsize,
                                       int *rcol0, int *rcol1, int *rrow0,
                                       int *rrow1) {
  assert(rcol0 && rcol1 && rrow0 && rrow1);

  if (bsize != cm->seq_params->sb_size) return 0;

  assert(!cm->features.all_lossless);

  const int is_uv = plane > 0;

  // Compute the mi-unit corners of the superblock
  const int mi_row0 = mi_row;
  const int mi_col0 = mi_col;
  const int mi_row1 = mi_row0 + mi_size_high[bsize];
  const int mi_col1 = mi_col0 + mi_size_wide[bsize];

  const RestorationInfo *rsi = &cm->rst_info[plane];
  const int size = rsi->restoration_unit_size;
  const int horz_units = rsi->horz_units;
  const int vert_units = rsi->vert_units;

  // The size of an MI-unit on this plane of the image
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int mi_size_x = MI_SIZE >> ss_x;
  const int mi_size_y = MI_SIZE >> ss_y;

  // Write m for the relative mi column or row, D for the superres denominator
  // and N for the superres numerator. If u is the upscaled pixel offset then
  // we can write the downscaled pixel offset in two ways as:
  //
  //   MI_SIZE * m = N / D u
  //
  // from which we get u = D * MI_SIZE * m / N
  const int mi_to_num_x = av1_superres_scaled(cm)
                              ? mi_size_x * cm->superres_scale_denominator
                              : mi_size_x;
  const int mi_to_num_y = mi_size_y;
  const int denom_x = av1_superres_scaled(cm) ? size * SCALE_NUMERATOR : size;
  const int denom_y = size;

  const int rnd_x = denom_x - 1;
  const int rnd_y = denom_y - 1;

  // rcol0/rrow0 should be the first column/row of restoration units that
  // doesn't start left/below of mi_col/mi_row. For this calculation, we need
  // to round up the division (if the sb starts at runit column 10.1, the first
  // matching runit has column index 11)
  *rcol0 = (mi_col0 * mi_to_num_x + rnd_x) / denom_x;
  *rrow0 = (mi_row0 * mi_to_num_y + rnd_y) / denom_y;

  // rel_col1/rel_row1 is the equivalent calculation, but for the superblock
  // below-right. If we're at the bottom or right of the frame, this restoration
  // unit might not exist, in which case we'll clamp accordingly.
  *rcol1 = AOMMIN((mi_col1 * mi_to_num_x + rnd_x) / denom_x, horz_units);
  *rrow1 = AOMMIN((mi_row1 * mi_to_num_y + rnd_y) / denom_y, vert_units);

  return *rcol0 < *rcol1 && *rrow0 < *rrow1;
}